

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRandom.cpp
# Opt level: O0

void anon_unknown.dwarf_85aa3::testErand48(void)

{
  ushort in_AX;
  long lVar1;
  ushort *puVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  unsigned_short state [3];
  undefined4 uStack_8;
  short local_4;
  short local_2;
  
  _uStack_8 = CONCAT26(2,CONCAT24(1,(uint)in_AX));
  puVar2 = (ushort *)((long)&uStack_8 + 2);
  Imath_2_5::erand48(puVar2);
  std::abs((int)puVar2);
  if (1e-05 <= extraout_XMM0_Qa) {
    __assert_fail("abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.671004) < 0.00001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                  ,0x4a,"void (anonymous namespace)::testErand48()");
  }
  puVar2 = (ushort *)((long)&uStack_8 + 2);
  Imath_2_5::erand48(puVar2);
  std::abs((int)puVar2);
  if (1e-05 <= extraout_XMM0_Qa_00) {
    __assert_fail("abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.786905) < 0.00001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                  ,0x4b,"void (anonymous namespace)::testErand48()");
  }
  puVar2 = (ushort *)((long)&uStack_8 + 2);
  Imath_2_5::erand48(puVar2);
  std::abs((int)puVar2);
  if (1e-05 <= extraout_XMM0_Qa_01) {
    __assert_fail("abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.316850) < 0.00001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                  ,0x4c,"void (anonymous namespace)::testErand48()");
  }
  puVar2 = (ushort *)((long)&uStack_8 + 2);
  Imath_2_5::erand48(puVar2);
  std::abs((int)puVar2);
  if (1e-05 <= extraout_XMM0_Qa_02) {
    __assert_fail("abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.384870) < 0.00001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                  ,0x4d,"void (anonymous namespace)::testErand48()");
  }
  puVar2 = (ushort *)((long)&uStack_8 + 2);
  Imath_2_5::erand48(puVar2);
  std::abs((int)puVar2);
  if (1e-05 <= extraout_XMM0_Qa_03) {
    __assert_fail("abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.854650) < 0.00001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                  ,0x4e,"void (anonymous namespace)::testErand48()");
  }
  lVar1 = Imath_2_5::nrand48((ushort *)((long)&uStack_8 + 2));
  if (lVar1 != 0x4f4e8cb0) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x4f4e8cb0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                  ,0x50,"void (anonymous namespace)::testErand48()");
  }
  lVar1 = Imath_2_5::nrand48((ushort *)((long)&uStack_8 + 2));
  if (lVar1 != 0x63e864b) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x063e864b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                  ,0x51,"void (anonymous namespace)::testErand48()");
  }
  lVar1 = Imath_2_5::nrand48((ushort *)((long)&uStack_8 + 2));
  if (lVar1 == 0x2d10f1dd) {
    lVar1 = Imath_2_5::nrand48((ushort *)((long)&uStack_8 + 2));
    if (lVar1 != 0x1aadc122) {
      __assert_fail("IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x1aadc122",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                    ,0x53,"void (anonymous namespace)::testErand48()");
    }
    lVar1 = Imath_2_5::nrand48((ushort *)((long)&uStack_8 + 2));
    if (lVar1 != 0x1836a71f) {
      __assert_fail("IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x1836a71f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                    ,0x54,"void (anonymous namespace)::testErand48()");
    }
    if (uStack_8._2_2_ != 0x2a42) {
      __assert_fail("state[0] == 0x2a42",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                    ,0x56,"void (anonymous namespace)::testErand48()");
    }
    if (local_4 == 0x4e3e) {
      if (local_2 == 0x306d) {
        return;
      }
      __assert_fail("state[2] == 0x306d",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                    ,0x58,"void (anonymous namespace)::testErand48()");
    }
    __assert_fail("state[1] == 0x4e3e",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                  ,0x57,"void (anonymous namespace)::testErand48()");
  }
  __assert_fail("IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x2d10f1dd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                ,0x52,"void (anonymous namespace)::testErand48()");
}

Assistant:

void
testErand48 ()
{
    //
    // Our implementation of erand48(), nrand48(), etc.
    // assumes that sizeof (unsigned short) == 2.
    //

    assert (sizeof (unsigned short) == 2);

    //
    // starting with a given seed, erand48() and nrand48()
    // must generate the same sequence as the standard
    // Unix/Linux functions.
    //

    unsigned short state[3];
    state[0] = 0;
    state[1] = 1;
    state[2] = 2;

    assert (abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.671004) < 0.00001);
    assert (abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.786905) < 0.00001);
    assert (abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.316850) < 0.00001);
    assert (abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.384870) < 0.00001);
    assert (abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.854650) < 0.00001);

    assert (IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x4f4e8cb0);
    assert (IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x063e864b);
    assert (IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x2d10f1dd);
    assert (IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x1aadc122);
    assert (IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x1836a71f);

    assert (state[0] == 0x2a42);
    assert (state[1] == 0x4e3e);
    assert (state[2] == 0x306d);
}